

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void realpath_cb(uv_fs_t *req)

{
  int iVar1;
  size_t sVar2;
  uv_fs_t *unaff_RBX;
  uv_fs_t *__s1;
  size_t test_file_abs_size;
  char test_file_abs_buf [4096];
  long alStack_1228 [3];
  undefined1 auStack_1210 [440];
  uv_fs_t *puStack_1058;
  undefined8 local_1020;
  char local_1018 [7];
  undefined4 auStack_1011 [1024];
  
  local_1020 = 0x1000;
  if (req->fs_type == UV_FS_REALPATH) {
    unaff_RBX = req;
    __s1 = req;
    if (req->result == 0) {
      uv_cwd(local_1018,&local_1020);
      sVar2 = strlen(local_1018);
      builtin_strncpy(local_1018 + sVar2,"/test_fi",8);
      *(undefined4 *)((long)auStack_1011 + sVar2) = 0x656c69;
      __s1 = (uv_fs_t *)req->ptr;
      iVar1 = strcmp((char *)__s1,local_1018);
      if (iVar1 == 0) {
        realpath_cb_count = realpath_cb_count + 1;
        uv_fs_req_cleanup(req);
        return;
      }
      goto LAB_0015f47f;
    }
  }
  else {
    realpath_cb_cold_1();
    __s1 = req;
  }
  realpath_cb_cold_2();
LAB_0015f47f:
  realpath_cb_cold_3();
  puStack_1058 = unaff_RBX;
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");
  rmdir("test_dir_symlink");
  alStack_1228[0] = 0x1000;
  loop = (uv_loop_t *)uv_default_loop();
  uv_fs_mkdir(0,auStack_1210,"test_dir",0x1ff,0);
  uv_fs_req_cleanup(auStack_1210);
  uv_cwd(test_symlink_dir_impl::test_dir_abs_buf,alStack_1228);
  sVar2 = strlen(test_symlink_dir_impl::test_dir_abs_buf);
  builtin_strncpy(test_symlink_dir_impl::test_dir_abs_buf + sVar2,"/test_di",8);
  (test_symlink_dir_impl::test_dir_abs_buf + sVar2 + 8)[0] = 'r';
  (test_symlink_dir_impl::test_dir_abs_buf + sVar2 + 8)[1] = '\0';
  alStack_1228[0] = alStack_1228[0] + 9;
  iVar1 = uv_fs_symlink(0,auStack_1210,"test_dir","test_dir_symlink",(ulong)__s1 & 0xffffffff,0);
  if (((int)__s1 == 1) && ((iVar1 == -1 || (iVar1 == -0x5f)))) {
    test_symlink_dir_impl_cold_1();
  }
  else {
    test_symlink_dir_impl_cold_2();
  }
  return;
}

Assistant:

static void realpath_cb(uv_fs_t* req) {
  char test_file_abs_buf[PATHMAX];
  size_t test_file_abs_size = sizeof(test_file_abs_buf);
  ASSERT(req->fs_type == UV_FS_REALPATH);
#ifdef _WIN32
  /*
   * Windows XP and Server 2003 don't support GetFinalPathNameByHandleW()
   */
  if (req->result == UV_ENOSYS) {
    realpath_cb_count++;
    uv_fs_req_cleanup(req);
    return;
  }
#endif
  ASSERT(req->result == 0);

  uv_cwd(test_file_abs_buf, &test_file_abs_size);
#ifdef _WIN32
  strcat(test_file_abs_buf, "\\test_file");
  ASSERT(stricmp(req->ptr, test_file_abs_buf) == 0);
#else
  strcat(test_file_abs_buf, "/test_file");
  ASSERT(strcmp(req->ptr, test_file_abs_buf) == 0);
#endif
  realpath_cb_count++;
  uv_fs_req_cleanup(req);
}